

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O3

int Map_MatchNodeCut(Map_Man_t *p,Map_Node_t *pNode,Map_Cut_t *pCut,int fPhase,float fWorstLimit)

{
  Map_Match_t *pM2;
  int iVar1;
  Map_Super_t *pMVar2;
  ulong uVar3;
  float fVar4;
  Map_Match_t MatchBest;
  float local_74;
  Map_Match_t local_68;
  ulong local_38;
  
  pM2 = pCut->M + fPhase;
  local_68._32_8_ = *(undefined8 *)&(pM2->tArrive).Worst;
  local_68.pSupers = pM2->pSupers;
  local_68.uPhase = pM2->uPhase;
  local_68.uPhaseBest = pM2->uPhaseBest;
  local_68.pSuperBest = pM2->pSuperBest;
  local_68.tArrive.Rise = (pM2->tArrive).Rise;
  local_68.tArrive.Fall = (pM2->tArrive).Fall;
  pMVar2 = pM2->pSupers;
  if (pMVar2 != (Map_Super_t *)0x0) {
    uVar3 = 0;
    local_74 = fWorstLimit;
    do {
      p->nMatches = p->nMatches + 1;
      if ((int)uVar3 == 0x1e) break;
      pM2->pSuperBest = pMVar2;
      local_38 = uVar3;
      if (0xfffffff < *(uint *)&pMVar2->field_0x4) {
        uVar3 = 0;
        do {
          p->nPhases = p->nPhases + 1;
          pM2->uPhaseBest = (uint)pMVar2->uPhases[uVar3] ^ pM2->uPhase;
          iVar1 = p->fMappingMode;
          if (iVar1 - 2U < 2) {
            fVar4 = Map_CutGetAreaDerefed(pCut,fPhase);
LAB_003feeb8:
            pM2->AreaFlow = fVar4;
            if (fVar4 <= local_68.AreaFlow + p->fEpsilon) {
              Map_TimeCutComputeArrival(pNode,pCut,fPhase,local_74);
              if ((pM2->tArrive).Worst <= p->fEpsilon + local_74) {
LAB_003feefb:
                iVar1 = Map_MatchCompare(p,&local_68,pM2,p->fMappingMode);
                if (iVar1 != 0) {
                  local_68._32_8_ = *(undefined8 *)&(pM2->tArrive).Worst;
                  local_68.pSupers = pM2->pSupers;
                  local_68.uPhase = pM2->uPhase;
                  local_68.uPhaseBest = pM2->uPhaseBest;
                  local_68.pSuperBest = pM2->pSuperBest;
                  local_68.tArrive.Rise = (pM2->tArrive).Rise;
                  local_68.tArrive.Fall = (pM2->tArrive).Fall;
                  if (p->fMappingMode == 0) {
                    local_74 = local_68.tArrive.Worst;
                  }
                }
              }
            }
          }
          else {
            if (iVar1 == 4) {
              fVar4 = Map_SwitchCutGetDerefed(pNode,pCut,fPhase);
              goto LAB_003feeb8;
            }
            if (iVar1 != 0) {
              fVar4 = Map_CutGetAreaFlow(pCut,fPhase);
              goto LAB_003feeb8;
            }
            Map_TimeCutComputeArrival(pNode,pCut,fPhase,local_74);
            if ((pM2->tArrive).Worst <= p->fEpsilon + local_74) {
              fVar4 = Map_CutGetAreaFlow(pCut,fPhase);
              pM2->AreaFlow = fVar4;
              goto LAB_003feefb;
            }
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < *(uint *)&pMVar2->field_0x4 >> 0x1c);
      }
      uVar3 = (ulong)((int)local_38 + 1);
      pMVar2 = pMVar2->pNext;
    } while (pMVar2 != (Map_Super_t *)0x0);
  }
  pM2->pSuperBest = local_68.pSuperBest;
  (pM2->tArrive).Rise = local_68.tArrive.Rise;
  (pM2->tArrive).Fall = local_68.tArrive.Fall;
  *(undefined8 *)&(pM2->tArrive).Worst = local_68._32_8_;
  pM2->pSupers = local_68.pSupers;
  pM2->uPhase = local_68.uPhase;
  pM2->uPhaseBest = local_68.uPhaseBest;
  if (pM2->pSuperBest != (Map_Super_t *)0x0) {
    Map_TimeCutComputeArrival(pNode,pCut,fPhase,3.4028235e+37);
    if (p->fMappingMode - 2U < 2) {
      fVar4 = Map_CutGetAreaDerefed(pCut,fPhase);
    }
    else if (p->fMappingMode == 4) {
      fVar4 = Map_SwitchCutGetDerefed(pNode,pCut,fPhase);
    }
    else {
      fVar4 = Map_CutGetAreaFlow(pCut,fPhase);
    }
    pM2->AreaFlow = fVar4;
  }
  return 1;
}

Assistant:

int Map_MatchNodeCut( Map_Man_t * p, Map_Node_t * pNode, Map_Cut_t * pCut, int fPhase, float fWorstLimit )
{
    Map_Match_t MatchBest, * pMatch = pCut->M + fPhase;
    Map_Super_t * pSuper;
    int i, Counter;

    // save the current match of the cut
    MatchBest = *pMatch;
    // go through the supergates
    for ( pSuper = pMatch->pSupers, Counter = 0; pSuper; pSuper = pSuper->pNext, Counter++ )
    {
        p->nMatches++;
        // this is an attempt to reduce the runtime of matching and area 
        // at the cost of rare and very minor increase in delay
        // (the supergates are sorted by increasing area)
        if ( Counter == 30 )
           break;

        // go through different phases of the given match and supergate
        pMatch->pSuperBest = pSuper;
        for ( i = 0; i < (int)pSuper->nPhases; i++ )
        {
            p->nPhases++;
            // find the overall phase of this match
            pMatch->uPhaseBest = pMatch->uPhase ^ pSuper->uPhases[i];
            if ( p->fMappingMode == 0 )
            {
                // get the arrival time
                Map_TimeCutComputeArrival( pNode, pCut, fPhase, fWorstLimit );
                // skip the cut if the arrival times exceed the required times
                if ( pMatch->tArrive.Worst > fWorstLimit + p->fEpsilon )
                    continue;
                // get the area (area flow)
                pMatch->AreaFlow = Map_CutGetAreaFlow( pCut, fPhase );
            }
            else
            {
                // get the area (area flow)
                if ( p->fMappingMode == 2 || p->fMappingMode == 3 )
                    pMatch->AreaFlow = Map_CutGetAreaDerefed( pCut, fPhase );
                else if ( p->fMappingMode == 4 )
                    pMatch->AreaFlow = Map_SwitchCutGetDerefed( pNode, pCut, fPhase );
                else 
                    pMatch->AreaFlow = Map_CutGetAreaFlow( pCut, fPhase );
                // skip if the cut is too large
                if ( pMatch->AreaFlow > MatchBest.AreaFlow + p->fEpsilon )
                    continue;
                // get the arrival time
                Map_TimeCutComputeArrival( pNode, pCut, fPhase, fWorstLimit );
                // skip the cut if the arrival times exceed the required times
                if ( pMatch->tArrive.Worst > fWorstLimit + p->fEpsilon )
                    continue;
            }

            // if the cut is non-trivial, compare it
            if ( Map_MatchCompare( p, &MatchBest, pMatch, p->fMappingMode ) )
            {
                MatchBest = *pMatch;
                // if we are mapping for delay, the worst-case limit should be reduced
                if ( p->fMappingMode == 0 )
                    fWorstLimit = MatchBest.tArrive.Worst;
            }
        }
    }
    // set the best match
    *pMatch = MatchBest;

    // recompute the arrival time and area (area flow) of this cut
    if ( pMatch->pSuperBest )
    {
        Map_TimeCutComputeArrival( pNode, pCut, fPhase, MAP_FLOAT_LARGE );
        if ( p->fMappingMode == 2 || p->fMappingMode == 3 )
            pMatch->AreaFlow = Map_CutGetAreaDerefed( pCut, fPhase );
        else if ( p->fMappingMode == 4 )
            pMatch->AreaFlow = Map_SwitchCutGetDerefed( pNode, pCut, fPhase );
        else 
            pMatch->AreaFlow = Map_CutGetAreaFlow( pCut, fPhase );
    }
    return 1;
}